

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  uint uVar2;
  undefined1 n [16];
  hex_writer f;
  string_view prefix;
  int iVar3;
  char *in_RDI;
  size_t unaff_retaddr;
  format_specs in_stack_00000010;
  int num_digits;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  internal *this_00;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this_01;
  undefined1 in_stack_ffffffffffffffe8 [12];
  int num_digits_00;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x20] = '0';
    cVar1 = *(char *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    in_RDI[(ulong)uVar2 + 0x20] = cVar1;
  }
  this_00 = *(internal **)(in_RDI + 0x10);
  this_01 = *(basic_writer<duckdb_fmt::v6::buffer_range<char>_> **)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff70;
  n._0_8_ = in_stack_ffffffffffffff68;
  iVar3 = count_digits<4u,unsigned__int128>(this_00,(unsigned___int128)n);
  num_digits_00 = (int)((ulong)this_00 >> 0x20);
  get_prefix((int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_> *)0x354b53);
  prefix.size_ = unaff_retaddr;
  prefix.data_ = in_RDI;
  f._12_4_ = iVar3;
  f.self = (int_writer<unsigned___int128,_duckdb_fmt::v6::basic_format_specs<char>_> *)
           in_stack_ffffffffffffffe8._0_8_;
  f.num_digits = in_stack_ffffffffffffffe8._8_4_;
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::hex_writer>
            (this_01,num_digits_00,prefix,in_stack_00000010,f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }